

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
embree::avx::HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
::parallel_object_split
          (HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,ObjectSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  undefined1 auVar1 [16];
  size_t begin;
  size_t end;
  long lVar2;
  size_t sVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  anon_class_1_0_00000001 local_11b;
  anon_class_1_0_00000001 local_11a;
  EmptyTy local_119;
  vbool vSplitMask;
  vint vSplitPos;
  anon_class_24_3_c5d13451 isLeft;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  unsigned_long uStack_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  unsigned_long uStack_40;
  
  begin = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  end = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  local_88.m128[0] = INFINITY;
  local_88.m128[1] = INFINITY;
  local_88.m128[2] = INFINITY;
  local_88.m128[3] = INFINITY;
  local_78 = 0xff800000;
  uStack_74 = 0xff800000;
  uStack_70 = 0xff800000;
  uStack_6c = 0xff800000;
  local_68 = 0x7f800000;
  uStack_64 = 0x7f800000;
  uStack_60 = 0x7f800000;
  uStack_5c = 0x7f800000;
  local_58 = 0xff800000;
  uStack_54 = 0xff800000;
  uStack_50 = 0xff800000;
  uStack_4c = 0xff800000;
  local_48 = 0;
  uStack_40 = 0;
  local_d8.m128[0] = INFINITY;
  local_d8.m128[1] = INFINITY;
  local_d8.m128[2] = INFINITY;
  local_d8.m128[3] = INFINITY;
  local_c8 = 0xff800000;
  uStack_c4 = 0xff800000;
  uStack_c0 = 0xff800000;
  uStack_bc = 0xff800000;
  local_b8 = 0x7f800000;
  uStack_b4 = 0x7f800000;
  uStack_b0 = 0x7f800000;
  uStack_ac = 0x7f800000;
  local_a8 = 0xff800000;
  uStack_a4 = 0xff800000;
  uStack_a0 = 0xff800000;
  uStack_9c = 0xff800000;
  local_98 = 0;
  uStack_90 = 0;
  auVar1._0_4_ = split->field_2;
  auVar1._4_4_ = split->data;
  auVar1._8_8_ = (split->mapping).num;
  vSplitPos.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar1,0);
  isLeft.vSplitPos = &vSplitPos;
  lVar2 = (1L << ((byte)split->dim & 0x3f)) * 0x10;
  vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar2);
  vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar2 + 8);
  isLeft.vSplitMask = &vSplitMask;
  isLeft.split = split;
  sVar3 = parallel_partitioning<embree::PrimRef,embree::PrimInfoT<embree::BBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_split(embree::avx::BinSplit<32ul>const&,embree::avx::PrimInfoExtRange_const&,embree::avx::PrimInfoExtRange&,embree::avx::PrimInfoExtRange&)::_lambda(embree::PrimRef_const&)_1_,embree::avx::HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_split(embree::avx::BinSplit<32ul>const&,embree::avx::PrimInfoExtRange_const&,embree::avx::PrimInfoExtRange&,embree::avx::PrimInfoExtRange&)::_lambda(embree::PrimInfoT<embree::BBox<embree::Vec3fa>>&,embree::PrimRef_const&)_1_,embree::avx::HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_split(embree::avx::BinSplit<32ul>const&,embree::avx::PrimInfoExtRange_const&,embree::avx::PrimInfoExtRange&,embree::avx::PrimInfoExtRange&)::_lambda(embree::PrimInfoT<embree::BBox<embree::Vec3fa>>&,embree::PrimInfoT<embree::BBox<embree::Vec3fa>>const&)_1_>
                    (this->prims0,begin,end,&local_119,
                     (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_88.field_1,
                     (PrimInfoT<embree::BBox<embree::Vec3fa>_> *)&local_d8.field_1,&isLeft,
                     &local_11a,&local_11b,0x80);
  *(ulong *)&(lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 =
       CONCAT44(local_88.m128[1],local_88.m128[0]);
  *(ulong *)((long)&(lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
       CONCAT44(local_88.m128[3],local_88.m128[2]);
  *(ulong *)&(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = CONCAT44(uStack_74,local_78);
  *(ulong *)((long)&(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
       CONCAT44(uStack_6c,uStack_70);
  *(ulong *)&(lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = CONCAT44(uStack_64,local_68);
  *(ulong *)((long)&(lset->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
       CONCAT44(uStack_5c,uStack_60);
  *(ulong *)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = CONCAT44(uStack_54,local_58);
  *(ulong *)((long)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
       CONCAT44(uStack_4c,uStack_50);
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = begin;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = sVar3;
  (lset->super_extended_range<unsigned_long>)._ext_end = sVar3;
  *(ulong *)&(rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 =
       CONCAT44(local_d8.m128[1],local_d8.m128[0]);
  *(ulong *)((long)&(rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
       CONCAT44(local_d8.m128[3],local_d8.m128[2]);
  *(ulong *)&(rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = CONCAT44(uStack_c4,local_c8);
  *(ulong *)((long)&(rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
       CONCAT44(uStack_bc,uStack_c0);
  *(ulong *)&(rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = CONCAT44(uStack_b4,local_b8);
  *(ulong *)((long)&(rset->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
       CONCAT44(uStack_ac,uStack_b0);
  *(ulong *)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = CONCAT44(uStack_a4,local_a8);
  *(ulong *)((long)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
       CONCAT44(uStack_9c,uStack_a0);
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = sVar3;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = end;
  (rset->super_extended_range<unsigned_long>)._ext_end = end;
  pVar4.second = uStack_90;
  pVar4.first = uStack_40;
  return pVar4;
}

Assistant:

__noinline std::pair<size_t,size_t> parallel_object_split(const ObjectSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset)
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo left(empty);
          PrimInfo right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim;

          const typename ObjectBinner::vint vSplitPos(splitPos);
          const typename ObjectBinner::vbool vSplitMask(splitDimMask);
          auto isLeft = [&] (const PrimRef &ref) { return split.mapping.bin_unsafe(ref,vSplitPos,vSplitMask); };

          const size_t center = parallel_partitioning(
            prims0,begin,end,EmptyTy(),left,right,isLeft,
            [] (PrimInfo &pinfo,const PrimRef &ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); },
            [] (PrimInfo &pinfo0,const PrimInfo &pinfo1) { pinfo0.merge(pinfo1); },
            PARALLEL_PARTITION_BLOCK_SIZE);

          const size_t left_weight  = left.end;
          const size_t right_weight = right.end;
          
          left.begin  = begin;  left.end  = center; 
          right.begin = center; right.end = end;
          
          new (&lset) PrimInfoExtRange(begin,center,center,left);
          new (&rset) PrimInfoExtRange(center,end,end,right);

          assert(area(left.geomBounds) >= 0.0f);
          assert(area(right.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }